

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O3

WriterData * __thiscall
SafeQueue<WriterData>::pop(WriterData *__return_storage_ptr__,SafeQueue<WriterData> *this)

{
  _Elt_pointer pWVar1;
  uint8_t *puVar2;
  Commands CVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtx);
  if (iVar6 == 0) {
    pWVar1 = (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    puVar2 = pWVar1->m_buffer;
    iVar6 = pWVar1->m_bufferLen;
    uVar5 = *(undefined4 *)&pWVar1->field_0xc;
    CVar3 = pWVar1->m_command;
    uVar4 = *(undefined4 *)&pWVar1->field_0x1c;
    __return_storage_ptr__->m_mainFile = pWVar1->m_mainFile;
    __return_storage_ptr__->m_command = CVar3;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
    __return_storage_ptr__->m_buffer = puVar2;
    __return_storage_ptr__->m_bufferLen = iVar6;
    *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar5;
    std::deque<WriterData,_std::allocator<WriterData>_>::pop_front(&(this->m_queue).c);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

virtual T pop()
    {
        std::lock_guard lk(m_mtx);

        T val = m_queue.front();
        m_queue.pop();

        return val;
    }